

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<32U,_2U,_buffer_layout_bfs>::operator()
          (fill<32U,_2U,_buffer_layout_bfs> *this,array<Stream,_32UL> *streams,uchar **buffer,
          array<unsigned_long,_32UL> *buffer_count)

{
  unsigned_long uVar1;
  uchar *__s1;
  unsigned_long uVar2;
  uchar *__s2;
  array<unsigned_long,_32UL> *buffer_count_00;
  int iVar3;
  long lVar4;
  unsigned_long *puVar5;
  long lVar6;
  uchar **from0;
  unsigned_long *puVar7;
  size_t __n;
  size_t local_68;
  fill<32U,_4U,_buffer_layout_bfs> local_5c;
  fill<32U,_5U,_buffer_layout_bfs> local_5b;
  fill<32U,_5U,_buffer_layout_bfs> local_5a;
  fill<32U,_4U,_buffer_layout_bfs> local_59;
  array<Stream,_32UL> *local_58;
  long local_50;
  unsigned_long *local_48;
  array<unsigned_long,_32UL> *local_40;
  unsigned_long *local_38;
  
  puVar5 = buffer_count->_M_elems + 4;
  local_38 = buffer_count->_M_elems + 5;
  local_50 = 0;
  local_68 = 0;
  local_58 = streams;
  local_48 = puVar5;
  local_40 = buffer_count;
  while ((buffer_count_00 = local_40, *puVar5 != 0 ||
         (fill<32U,_4U,_buffer_layout_bfs>::operator()(&local_59,local_58,buffer,local_40),
         buffer_count_00->_M_elems[4] != 0))) {
    puVar7 = local_38;
    if ((*local_38 == 0) &&
       (fill<32U,_5U,_buffer_layout_bfs>::operator()(&local_5a,local_58,buffer,buffer_count_00),
       buffer_count_00->_M_elems[5] == 0)) {
      __n = -local_50;
      lVar4 = -local_68;
      goto LAB_0012bbc0;
    }
    uVar1 = *puVar5;
    __s1 = buffer[0x27 - uVar1];
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    uVar2 = *puVar7;
    __s2 = buffer[0x3e - uVar2];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    puVar5 = local_48;
    if (iVar3 < 1) {
      puVar7 = local_48;
      __s2 = __s1;
      uVar2 = uVar1;
    }
    buffer[local_68] = __s2;
    *puVar7 = uVar2 - 1;
    check_input(buffer,local_68);
    local_68 = local_68 + 1;
    local_50 = local_50 + -8;
    if (local_68 == 8) {
      local_40->_M_elems[2] = 8;
      return;
    }
  }
  lVar6 = -0x40 - local_50;
  lVar4 = 8 - local_68;
  do {
    if ((buffer_count_00->_M_elems[5] == 0) &&
       (fill<32U,_5U,_buffer_layout_bfs>::operator()(&local_5b,local_58,buffer,buffer_count_00),
       buffer_count_00->_M_elems[5] == 0)) {
      from0 = (uchar **)((long)buffer - lVar6);
      memmove(buffer + lVar4,buffer,lVar6 + 0x40);
      buffer_count_00->_M_elems[2] = local_68;
      goto LAB_0012bc1d;
    }
    uVar1 = buffer_count_00->_M_elems[5];
    buffer[local_68] = buffer[0x3e - uVar1];
    buffer_count_00->_M_elems[5] = uVar1 - 1;
    lVar4 = lVar4 + -1;
    local_68 = local_68 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0);
  goto LAB_0012bc0d;
  while( true ) {
    uVar1 = *puVar5;
    *(uchar **)((long)buffer + __n) = buffer[0x27 - uVar1];
    *puVar5 = uVar1 - 1;
    lVar4 = lVar4 + -1;
    __n = __n + 8;
    if (__n == 0x40) break;
LAB_0012bbc0:
    if ((*puVar5 == 0) &&
       (fill<32U,_4U,_buffer_layout_bfs>::operator()(&local_5c,local_58,buffer,buffer_count_00),
       buffer_count_00->_M_elems[4] == 0)) {
      local_68 = -lVar4;
      memmove(buffer + lVar4 + 8,buffer,__n);
      buffer_count_00->_M_elems[2] = local_68;
      from0 = (uchar **)((long)buffer + (0x40 - __n));
      goto LAB_0012bc1d;
    }
  }
LAB_0012bc0d:
  buffer_count_00->_M_elems[2] = 8;
  local_68 = 8;
  from0 = buffer;
LAB_0012bc1d:
  check_input(from0,local_68);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}